

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O1

void __thiscall cppcms::xss::basic_rules_holder::add_entity(basic_rules_holder *this,string *name)

{
  c_string local_40;
  
  details::c_string::c_string(&local_40,name);
  std::
  _Rb_tree<cppcms::xss::details::c_string,_cppcms::xss::details::c_string,_std::_Identity<cppcms::xss::details::c_string>,_cppcms::xss::compare_c_string,_std::allocator<cppcms::xss::details::c_string>_>
  ::_M_insert_unique<cppcms::xss::details::c_string>(&(this->entities)._M_t,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.container_._M_dataplus._M_p != &local_40.container_.field_2) {
    operator_delete(local_40.container_._M_dataplus._M_p);
  }
  return;
}

Assistant:

void add_entity(std::string const &name)
		{
			entities.insert(c_string(name));
		}